

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayTextureSizeTFBase::deleteTestSpecificObjects
          (TextureCubeMapArrayTextureSizeTFBase *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x40))(0x8c8e,0);
  (**(code **)(lVar2 + 0x48))(0x8c8e,0,0);
  if (this->m_tf_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_tf_bo_id);
    this->m_tf_bo_id = 0;
  }
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeTFBase::deleteTestSpecificObjects(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0);

	/* Delete transform feedback buffer */
	if (m_tf_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_tf_bo_id);
		m_tf_bo_id = 0;
	}
}